

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::updateSelfPotentials(SPFForceManager *this)

{
  Snapshot *in_RDI;
  potVec selfPotentials;
  Snapshot *this_00;
  Vector<double,_7U> *in_stack_ffffffffffffff18;
  Vector<double,_7U> *in_stack_ffffffffffffff20;
  Vector<double,_7U> *in_stack_ffffffffffffffd8;
  Vector<double,_7U> *in_stack_ffffffffffffffe0;
  SPFForceManager *in_stack_ffffffffffffffe8;
  
  Snapshot::getSelfPotentials(in_RDI);
  Snapshot::getSelfPotentials(in_RDI);
  linearCombination<OpenMD::Vector<double,7u>>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (Snapshot *)
            in_RDI[1].rigidbodyData.force.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  Vector<double,_7U>::Vector(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Snapshot::setSelfPotentials(this_00,(potVec *)in_RDI);
  return;
}

Assistant:

void SPFForceManager::updateSelfPotentials() {
    potVec selfPotentials =
        linearCombination(temporarySourceSnapshot_->getSelfPotentials(),
                          temporarySinkSnapshot_->getSelfPotentials());
    currentSnapshot_->setSelfPotentials(selfPotentials);
  }